

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t archive_read_support_format_cab(archive *_a)

{
  int iVar1;
  void *format_data;
  wchar_t magic_test;
  wchar_t r;
  cab *cab;
  archive_read *a;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_cab");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    format_data = calloc(1,0x1c0);
    if (format_data == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate CAB data");
      _a_local._4_4_ = L'\xffffffe2';
    }
    else {
      *(undefined8 *)((long)format_data + 0x78) = 0;
      *(undefined8 *)((long)format_data + 0x80) = 0;
      *(undefined8 *)((long)format_data + 0x88) = 0;
      archive_wstring_ensure((archive_wstring *)((long)format_data + 0x78),0x100);
      iVar1 = __archive_read_register_format
                        ((archive_read *)_a,format_data,"cab",archive_read_format_cab_bid,
                         archive_read_format_cab_options,archive_read_format_cab_read_header,
                         archive_read_format_cab_read_data,archive_read_format_cab_read_data_skip,
                         (_func_int64_t_archive_read_ptr_int64_t_int *)0x0,
                         archive_read_format_cab_cleanup,(_func_int_archive_read_ptr *)0x0,
                         (_func_int_archive_read_ptr *)0x0);
      if (iVar1 != 0) {
        free(format_data);
      }
      _a_local._4_4_ = L'\0';
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_support_format_cab(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct cab *cab;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_cab");

	cab = (struct cab *)calloc(1, sizeof(*cab));
	if (cab == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate CAB data");
		return (ARCHIVE_FATAL);
	}
	archive_string_init(&cab->ws);
	archive_wstring_ensure(&cab->ws, 256);

	r = __archive_read_register_format(a,
	    cab,
	    "cab",
	    archive_read_format_cab_bid,
	    archive_read_format_cab_options,
	    archive_read_format_cab_read_header,
	    archive_read_format_cab_read_data,
	    archive_read_format_cab_read_data_skip,
	    NULL,
	    archive_read_format_cab_cleanup,
	    NULL,
	    NULL);

	if (r != ARCHIVE_OK)
		free(cab);
	return (ARCHIVE_OK);
}